

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void HE16_SSE2(uint8_t *dst)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  
  uVar1 = 0x11;
  do {
    auVar3 = ZEXT216(CONCAT11(dst[-1],dst[-1]));
    auVar3 = pshuflw(auVar3,auVar3,0);
    uVar2 = auVar3._0_4_;
    *(undefined4 *)dst = uVar2;
    *(undefined4 *)(dst + 4) = uVar2;
    *(undefined4 *)(dst + 8) = uVar2;
    *(undefined4 *)(dst + 0xc) = uVar2;
    dst = dst + 0x20;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  return;
}

Assistant:

static void HE16_SSE2(uint8_t* dst) {     // horizontal
  int j;
  for (j = 16; j > 0; --j) {
    const __m128i values = _mm_set1_epi8((char)dst[-1]);
    _mm_storeu_si128((__m128i*)dst, values);
    dst += BPS;
  }
}